

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall
benchmark::internal::BenchmarkImp::RangePair(BenchmarkImp *this,int lo1,int hi1,int lo2,int hi2)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  int j;
  int i;
  vector<int,_std::allocator<int>_> arglist2;
  vector<int,_std::allocator<int>_> arglist1;
  
  if ((this->arg_count_ != 2) && (this->arg_count_ != -1)) {
    CheckHandler::CheckHandler
              ((CheckHandler *)&arglist1,"arg_count_ == -1 || arg_count_ == 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"RangePair",0x1c2);
    CheckHandler::~CheckHandler((CheckHandler *)&arglist1);
  }
  GetNullLogInstance();
  this->arg_count_ = 2;
  arglist1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  arglist1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  arglist1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  arglist2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  arglist2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  arglist2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  AddRange(&arglist1,lo1,hi1,8);
  AddRange(&arglist2,lo2,hi2,8);
  piVar2 = arglist1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar4 = arglist1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar1 = arglist2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish, piVar4 != piVar2; piVar4 = piVar4 + 1) {
    i = *piVar4;
    for (piVar3 = arglist2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
      j = *piVar3;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->args_,&i,&j
                );
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&arglist2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&arglist1.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void BenchmarkImp::RangePair(int lo1, int hi1, int lo2, int hi2) {
  CHECK(arg_count_ == -1 || arg_count_ == 2);
  arg_count_ = 2;
  std::vector<int> arglist1, arglist2;
  AddRange(&arglist1, lo1, hi1, kRangeMultiplier);
  AddRange(&arglist2, lo2, hi2, kRangeMultiplier);

  for (int i : arglist1) {
    for (int j : arglist2) {
      args_.emplace_back(i, j);
    }
  }
}